

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Help_View.cxx
# Opt level: O2

void __thiscall Fl_Help_View::end_selection(Fl_Help_View *this,int clipboard)

{
  byte *pbVar1;
  byte bVar2;
  bool bVar3;
  bool bVar4;
  wchar_t wVar5;
  int iVar6;
  uint uVar7;
  size_t sVar8;
  EVP_PKEY_CTX *dst;
  char *pcVar9;
  int iVar10;
  uint uVar11;
  byte *__s;
  EVP_PKEY_CTX *buf;
  uint uVar12;
  long lVar13;
  byte *p;
  
  if ((selected == 0) || (current_view != this)) {
    return;
  }
  __s = (byte *)this->value_;
  sVar8 = strlen((char *)__s);
  dst = (EVP_PKEY_CTX *)malloc((long)((int)sVar8 + 1));
  bVar4 = false;
  uVar11 = 0;
  buf = dst;
LAB_001b4f64:
  do {
    p = __s + 1;
    bVar2 = *__s;
    if (bVar2 == 0x26) {
      uVar7 = quote_char((char *)p);
      lVar13 = 1;
      uVar12 = 0x26;
      if (-1 < (int)uVar7) {
        do {
          pbVar1 = __s + lVar13;
          lVar13 = lVar13 + 1;
          uVar12 = uVar7;
          if (*pbVar1 == 0x3b) break;
        } while (*pbVar1 != 0);
      }
    }
    else {
      if (bVar2 == 0) goto LAB_001b52d1;
      lVar13 = 1;
      uVar12 = (uint)bVar2;
      if (bVar2 == 0x3c) {
        iVar10 = (int)__s + 1;
        do {
          bVar2 = *p;
          if (bVar2 == 0) goto LAB_001b52d1;
          p = p + 1;
          iVar10 = iVar10 + 1;
        } while (bVar2 != 0x3e);
        iVar6 = tolower((int)(char)__s[1]);
        uVar12 = iVar6 << 0x18;
        bVar2 = __s[2];
        if ((0x3e < (ulong)bVar2) || ((0x4000000100000001U >> ((ulong)bVar2 & 0x3f) & 1) == 0)) {
          iVar6 = tolower((int)(char)bVar2);
          uVar12 = uVar12 | iVar6 << 0x10;
          bVar2 = __s[3];
          if (((ulong)bVar2 < 0x3f) && ((0x4000000100000001U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
          goto LAB_001b5086;
          iVar6 = tolower((int)(char)bVar2);
          uVar12 = uVar12 | iVar6 << 8;
          bVar2 = __s[4];
          if (((ulong)bVar2 < 0x3f) && ((0x4000000100000001U >> ((ulong)bVar2 & 0x3f) & 1) != 0))
          goto LAB_001b5086;
          if (((ulong)__s[5] < 0x3f) && ((0x4000000100000001U >> ((ulong)__s[5] & 0x3f) & 1) != 0))
          {
            uVar7 = tolower((int)(char)bVar2);
            uVar12 = uVar12 | uVar7;
            goto LAB_001b5086;
          }
LAB_001b523d:
          bVar3 = true;
          pcVar9 = (char *)0x0;
          goto LAB_001b526d;
        }
LAB_001b5086:
        if (((((uVar12 == 0x2f683100) || (uVar12 == 0x2f683200)) || (uVar12 == 0x2f683300)) ||
            ((uVar12 == 0x2f683400 || (uVar12 == 0x2f683500)))) || (uVar12 == 0x2f683600))
        goto LAB_001b519a;
        if (uVar12 == 0x2f700000) {
LAB_001b5232:
          bVar3 = false;
          pcVar9 = "\n";
        }
        else {
          bVar3 = true;
          if (uVar12 == 0x2f707265) {
            pcVar9 = (char *)0x0;
            bVar4 = false;
          }
          else {
            if (uVar12 == 0x62720000) goto LAB_001b5232;
            if (uVar12 == 0x64640000) {
              bVar3 = false;
              pcVar9 = "\n - ";
            }
            else if (uVar12 == 0x64740000) {
              bVar3 = false;
              pcVar9 = "\n ";
            }
            else if (((uVar12 == 0x68310000) || (uVar12 == 0x68320000)) ||
                    ((uVar12 == 0x68330000 ||
                     (((uVar12 == 0x68340000 || (uVar12 == 0x68350000)) || (uVar12 == 0x68360000))))
                    )) {
LAB_001b519a:
              bVar3 = false;
              pcVar9 = "\n\n";
            }
            else {
              if (uVar12 != 0x6c690000) {
                if (uVar12 != 0x70000000) {
                  if (uVar12 == 0x74720000) goto LAB_001b519a;
                  if (uVar12 != 0x74640000) {
                    if (uVar12 != 0x70726500) goto LAB_001b523d;
                    bVar3 = true;
                    pcVar9 = (char *)0x0;
                    bVar4 = true;
                    goto LAB_001b526d;
                  }
                }
                goto LAB_001b5232;
              }
              bVar3 = false;
              pcVar9 = "\n * ";
            }
          }
        }
LAB_001b526d:
        __s = p;
        if (((!bVar3) && (iVar10 = iVar10 - *(int *)&this->value_, selection_first < iVar10)) &&
           (iVar10 <= selection_last)) {
          for (; (EVP_PKEY_CTX)*pcVar9 != (EVP_PKEY_CTX)0x0;
              pcVar9 = (char *)((EVP_PKEY_CTX *)pcVar9 + 1)) {
            *buf = (EVP_PKEY_CTX)*pcVar9;
            buf = buf + 1;
          }
          uVar11 = (uint)(byte)((EVP_PKEY_CTX *)pcVar9)[-1];
          iVar10 = isspace(uVar11);
          if (iVar10 != 0) {
            uVar11 = 0x20;
          }
        }
        goto LAB_001b4f64;
      }
    }
    iVar10 = (int)p - *(int *)&this->value_;
    if ((selection_first < iVar10) && (iVar10 <= selection_last)) {
      if ((!bVar4) && (((int)uVar12 < 0x100 && (iVar6 = isspace(uVar12), iVar6 != 0)))) {
        uVar12 = 0x20;
      }
      if (uVar12 == 0x20 && uVar11 == 0x20) {
        uVar11 = 0x20;
      }
      else {
        uVar11 = uVar12;
        if (lVar13 == 1) {
          *buf = SUB41(uVar12,0);
          buf = buf + 1;
        }
        else {
          wVar5 = fl_utf8encode(uVar12,(char *)buf);
          buf = buf + wVar5;
        }
      }
    }
    __s = __s + lVar13;
    if (selection_last < iVar10) {
LAB_001b52d1:
      *buf = (EVP_PKEY_CTX)0x0;
      sVar8 = strlen((char *)dst);
      Fl::copy(dst,(EVP_PKEY_CTX *)(sVar8 & 0xffffffff));
      free(dst);
      return;
    }
  } while( true );
}

Assistant:

void Fl_Help_View::end_selection(int clipboard)
{
  if (!selected || current_view!=this)
    return;
  // convert the select part of our html text into some kind of somewhat readable UTF-8
  // and store it in the selection buffer
  int p = 0;
  char pre = 0;
  int len = (int) strlen(value_);
  char *txt = (char*)malloc(len+1), *d = txt;
  const char *s = value_, *cmd, *src;
  for (;;) {
    int c = (*s++) & 0xff;
    if (c==0) break;
    if (c=='<') { // begin of some html command. Skip until we find a '>'
      cmd = s;
      for (;;) {
        c = (*s++) & 0xff;
        if (c==0 || c=='>') break;
      }
      if (c==0) break;
      // do something with this command... .
      // The replacement string must not be longer than the command
      // itself plus '<' and '>'
      src = 0;
      switch (command(cmd)) {
        case CMD('p','r','e', 0 ): pre = 1; break;
        case CMD('/','p','r','e'): pre = 0; break;
        case CMD('t','d', 0 , 0 ):
        case CMD('p', 0 , 0 , 0 ):
        case CMD('/','p', 0 , 0 ):
        case CMD('b','r', 0 , 0 ): src = "\n"; break;
        case CMD('l','i', 0 , 0 ): src = "\n * "; break;
        case CMD('/','h','1', 0 ):
        case CMD('/','h','2', 0 ):
        case CMD('/','h','3', 0 ):
        case CMD('/','h','4', 0 ):
        case CMD('/','h','5', 0 ):
        case CMD('/','h','6', 0 ): src = "\n\n"; break;
        case CMD('t','r', 0 , 0 ):
        case CMD('h','1', 0 , 0 ):
        case CMD('h','2', 0 , 0 ):
        case CMD('h','3', 0 , 0 ):
        case CMD('h','4', 0 , 0 ):
        case CMD('h','5', 0 , 0 ):
        case CMD('h','6', 0 , 0 ): src = "\n\n"; break;
        case CMD('d','t', 0 , 0 ): src = "\n "; break;
        case CMD('d','d', 0 , 0 ): src = "\n - "; break;
      }
      int n = (int) (s-value_);
      if (src && n>selection_first && n<=selection_last) {
        while (*src) {
          *d++ = *src++;
        }
        c = src[-1] & 0xff;
        p = isspace(c) ? ' ' : c;
      }
      continue;
    }
    const char *s2 = s;
    if (c=='&') { // special characters (HTML entities)
      int xx = quote_char(s);
      if (xx >= 0) {
        c = xx;
        for (;;) {
          char cc = *s++;
          if (!cc || cc==';') break;
        }
      }
    }
    int n = (int) (s2-value_);
    if (n>selection_first && n<=selection_last) {
      if (!pre && c < 256 && isspace(c)) c = ' ';
      if (p != ' ' || c != ' ') {
        if (s2 != s) { // c was an HTML entity
          d += fl_utf8encode(c, d);
        }
        else *d++ = c;
      }
      p = c;
    }
    if (n>selection_last) break; // stop parsing html after end of selection
  }
  *d = 0;
  Fl::copy(txt, (int) strlen(txt), clipboard);
  // printf("copy [%s]\n", txt);
  free(txt);
}